

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BgzfStream_p.cpp
# Opt level: O2

void __thiscall BamTools::Internal::BgzfStream::Close(BgzfStream *this)

{
  int iVar1;
  size_t sVar2;
  
  if (this->m_device != (IBamIODevice *)0x0) {
    iVar1 = (*this->m_device->_vptr_IBamIODevice[10])();
    if ((char)iVar1 != '\0') {
      iVar1 = (*this->m_device->_vptr_IBamIODevice[0xb])();
      if (iVar1 == 2) {
        FlushBlock(this);
        sVar2 = DeflateBlock(this,0);
        (*this->m_device->_vptr_IBamIODevice[8])
                  (this->m_device,(this->m_compressedBlock).Buffer,sVar2 & 0xffffffff);
      }
    }
    (*this->m_device->_vptr_IBamIODevice[2])();
    if (this->m_device != (IBamIODevice *)0x0) {
      (*this->m_device->_vptr_IBamIODevice[1])();
    }
    this->m_device = (IBamIODevice *)0x0;
    memset((this->m_uncompressedBlock).Buffer,0,(this->m_uncompressedBlock).NumBytes);
    memset((this->m_compressedBlock).Buffer,0,(this->m_compressedBlock).NumBytes);
    this->m_blockLength = 0;
    this->m_blockOffset = 0;
    this->m_blockAddress = 0;
    this->m_isWriteCompressed = true;
  }
  return;
}

Assistant:

void BgzfStream::Close(void) {

    // skip if no device open
    if ( m_device == 0 ) return;

    // if writing to file, flush the current BGZF block,
    // then write an empty block (as EOF marker)
    if ( m_device->IsOpen() && (m_device->Mode() == IBamIODevice::WriteOnly) ) {
        FlushBlock();
        const size_t blockLength = DeflateBlock(0);
        m_device->Write(m_compressedBlock.Buffer, blockLength);
    }

    // close device
    m_device->Close();
    delete m_device;
    m_device = 0;

    // ensure our buffers are cleared out
    m_uncompressedBlock.Clear();
    m_compressedBlock.Clear();

    // reset state
    m_blockLength = 0;
    m_blockOffset = 0;
    m_blockAddress = 0;
    m_isWriteCompressed = true;
}